

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_path.c
# Opt level: O2

void test_archive_match_path(void)

{
  wchar_t wVar1;
  archive *paVar2;
  archive_entry *paVar3;
  char *mp;
  wchar_t *local_38;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'Ʋ',"exclusion",L'ƶ',L'\xffffffff',"second\nfour\n");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'Ƴ',"exclusion_null",L'ƶ',L'\f',"second");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'Ƶ',"inclusion",L'ƶ',L'\xffffffff',"first\nthird\n");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'ƶ',"inclusion_null",L'ƶ',L'\f',"first");
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'\"',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'$',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_exclude_pattern(paVar2,"^aa*");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'*',0,"0",(long)wVar1,"archive_match_exclude_pattern(m, \"^aa*\")",
                          paVar2);
      archive_entry_copy_pathname(paVar3,"aa1234");
      failure("\'aa1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'/',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'0',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 1);
      failure("\'aa1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'4',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'5',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_pathname(paVar3,"a1234");
      failure("\'a1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L':',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L';',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 2);
      failure("\'a1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'?',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'@',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'M',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'O',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_exclude_pattern_w(paVar2,anon_var_dwarf_fdbf);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'U',0,"0",(long)wVar1,"archive_match_exclude_pattern_w(m, L\"^aa*\")",
                          paVar2);
      archive_entry_copy_pathname(paVar3,"aa1234");
      failure("\'aa1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Z',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'[',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 1);
      failure("\'aa1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'_',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'`',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_pathname(paVar3,"a1234");
      failure("\'a1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'e',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'f',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 2);
      failure("\'a1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'j',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'k',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'²',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    wVar1 = archive_match_exclude_pattern_from_file(paVar2,"exclusion",L'\0');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'µ',0,"0",(long)wVar1,
                        "archive_match_exclude_pattern_from_file(m, \"exclusion\", 0)",paVar2);
    exclusion_from_file(paVar2);
    archive_match_free(paVar2);
    paVar2 = archive_match_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'»',(uint)(paVar2 != (archive *)0x0),
                             "(m = archive_match_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_exclude_pattern_from_file(paVar2,"exclusion_null",L'\x01');
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'¿',0,"0",(long)wVar1,
                          "archive_match_exclude_pattern_from_file(m, \"exclusion_null\", 1)",paVar2
                         );
      exclusion_from_file(paVar2);
      archive_match_free(paVar2);
    }
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'Ë',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    wVar1 = archive_match_exclude_pattern_from_file_w(paVar2,anon_var_dwarf_fe9b,L'\0');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'Î',0,"0",(long)wVar1,
                        "archive_match_exclude_pattern_from_file_w(m, L\"exclusion\", 0)",paVar2);
    exclusion_from_file(paVar2);
    archive_match_free(paVar2);
    paVar2 = archive_match_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'Ô',(uint)(paVar2 != (archive *)0x0),
                             "(m = archive_match_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_exclude_pattern_from_file_w(paVar2,anon_var_dwarf_fec7,L'\x01');
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ø',0,"0",(long)wVar1,
                          "archive_match_exclude_pattern_from_file_w(m, L\"exclusion_null\", 1)",
                          paVar2);
      exclusion_from_file(paVar2);
      archive_match_free(paVar2);
    }
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'å',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'ç',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_pattern(paVar2,"^aa*");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'í',0,"0",(long)wVar1,"archive_match_include_pattern(m, \"^aa*\")",
                          paVar2);
      archive_entry_copy_pathname(paVar3,"aa1234");
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ò',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ó',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 1);
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'÷',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ø',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_pathname(paVar3,"a1234");
      failure("\'a1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ý',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'þ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 2);
      failure("\'a1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ă',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ă',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions(paVar2);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ć',0,"0",(long)wVar1,"archive_match_path_unmatched_inclusions(m)",
                          (void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions_next(paVar2,&mp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ĉ',1,"ARCHIVE_EOF",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next(m, &mp)",paVar2);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'Ė',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'Ę',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_pattern_w(paVar2,anon_var_dwarf_fdbf);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ğ',0,"0",(long)wVar1,"archive_match_include_pattern_w(m, L\"^aa*\")",
                          paVar2);
      archive_entry_copy_pathname(paVar3,"aa1234");
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ģ',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ĥ',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 1);
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ĩ',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ĩ',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_pathname(paVar3,"a1234");
      failure("\'a1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Į',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'į',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 2);
      failure("\'a1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ĳ',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ĵ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions(paVar2);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ķ',0,"0",(long)wVar1,"archive_match_path_unmatched_inclusions(m)",
                          (void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions_next(paVar2,&mp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ĺ',1,"ARCHIVE_EOF",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next(m, &mp)",paVar2);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'ņ',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    wVar1 = archive_match_include_pattern_from_file(paVar2,"inclusion",L'\0');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'ŉ',0,"0",(long)wVar1,
                        "archive_match_include_pattern_from_file(m, \"inclusion\", 0)",paVar2);
    exclusion_from_file(paVar2);
    archive_match_free(paVar2);
    paVar2 = archive_match_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'ŏ',(uint)(paVar2 != (archive *)0x0),
                             "(m = archive_match_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_pattern_from_file(paVar2,"inclusion_null",L'\x01');
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Œ',0,"0",(long)wVar1,
                          "archive_match_include_pattern_from_file(m, \"inclusion_null\", 1)",paVar2
                         );
      exclusion_from_file(paVar2);
      archive_match_free(paVar2);
    }
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'Ş',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    wVar1 = archive_match_include_pattern_from_file_w(paVar2,anon_var_dwarf_ff8f,L'\0');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'Ţ',0,"0",(long)wVar1,
                        "archive_match_include_pattern_from_file_w(m, L\"inclusion\", 0)",paVar2);
    exclusion_from_file(paVar2);
    archive_match_free(paVar2);
    paVar2 = archive_match_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'Ũ',(uint)(paVar2 != (archive *)0x0),
                             "(m = archive_match_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_pattern_from_file_w(paVar2,anon_var_dwarf_ffa5,L'\x01');
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ŭ',0,"0",(long)wVar1,
                          "archive_match_include_pattern_from_file_w(m, L\"inclusion_null\", 1)",
                          paVar2);
      exclusion_from_file(paVar2);
      archive_match_free(paVar2);
    }
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'ź',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'ż',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_exclude_pattern(paVar2,"^aaa*");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɓ',0,"0",(long)wVar1,"archive_match_exclude_pattern(m, \"^aaa*\")",
                          paVar2);
      wVar1 = archive_match_include_pattern_w(paVar2,anon_var_dwarf_fdbf);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ƃ',0,"0",(long)wVar1,"archive_match_include_pattern_w(m, L\"^aa*\")",
                          paVar2);
      wVar1 = archive_match_include_pattern(paVar2,"^a1*");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƃ',0,"0",(long)wVar1,"archive_match_include_pattern(m, \"^a1*\")",
                          paVar2);
      archive_entry_copy_pathname(paVar3,"aa1234");
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƈ',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɖ',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021 + 1);
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƍ',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ǝ',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_pathname(paVar3,"aaa1234");
      failure("\'aaa1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɠ',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɣ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear(paVar3);
      archive_entry_copy_pathname_w(paVar3,anon_var_dwarf_10021);
      failure("\'aaa1234\' should be excluded");
      wVar1 = archive_match_path_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ƙ',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƙ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions(paVar2);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɯ',1,"1",(long)wVar1,"archive_match_path_unmatched_inclusions(m)",
                          (void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions_next(paVar2,&mp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɵ',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next(m, &mp)",paVar2);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                 ,L'Ơ',"^a1*","\"^a1*\"",mp,"mp",(void *)0x0,L'\0');
      wVar1 = archive_match_path_unmatched_inclusions_next(paVar2,&mp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ƣ',1,"ARCHIVE_EOF",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next(m, &mp)",paVar2);
      wVar1 = archive_match_path_unmatched_inclusions_next_w(paVar2,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƥ',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next_w(m, &wp)",paVar2);
      assertion_equal_wstring
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                 ,L'Ʀ',anon_var_dwarf_10088,"L\"^a1*\"",local_38,"wp",(void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions_next_w(paVar2,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƨ',1,"ARCHIVE_EOF",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next_w(m, &wp)",paVar2);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_match_path)
{
	/* Make exclusion sample files which contain exclusion patterns. */
	assertMakeFile("exclusion", 0666, "second\nfour\n");
	assertMakeBinFile("exclusion_null", 0666, 12, "second\0four\0");
	/* Make inclusion sample files which contain inclusion patterns. */
	assertMakeFile("inclusion", 0666, "first\nthird\n");
	assertMakeBinFile("inclusion_null", 0666, 12, "first\0third\0");

	test_exclusion_mbs();
	test_exclusion_wcs();
	test_exclusion_from_file_mbs();
	test_exclusion_from_file_wcs();
	test_inclusion_mbs();
	test_inclusion_wcs();
	test_inclusion_from_file_mbs();
	test_inclusion_from_file_wcs();
	test_exclusion_and_inclusion();
}